

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::clear(Mat *this)

{
  pointer p_Var1;
  pointer p_Var2;
  allocator_type local_29;
  vector<__int128,_std::allocator<__int128>_> local_28;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (&local_28,(long)this->c * (long)this->r,&local_29);
  p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var2 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (p_Var1 != (pointer)0x0) {
    operator_delete(p_Var1,(long)p_Var2 - (long)p_Var1);
    if (local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Mat::clear() {
    val = vector<ll128>(r * c);
}